

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuHeapS.c
# Opt level: O2

void Fxu_HeapSingleMoveUp(Fxu_HeapSingle *p,Fxu_Single *pSingle)

{
  Fxu_Single **pSingle2;
  uint uVar1;
  Fxu_Single **pSingle1;
  
  pSingle1 = p->pTree + pSingle->HNum;
  while( true ) {
    uVar1 = (*pSingle1)->HNum;
    if ((int)uVar1 < 2) {
      return;
    }
    uVar1 = uVar1 >> 1;
    if ((*pSingle1)->Weight <= p->pTree[uVar1]->Weight) break;
    pSingle2 = p->pTree + uVar1;
    Fxu_HeapSingleSwap(pSingle1,pSingle2);
    pSingle1 = pSingle2;
  }
  return;
}

Assistant:

void Fxu_HeapSingleMoveUp( Fxu_HeapSingle * p, Fxu_Single * pSingle )
{
    Fxu_Single ** ppSingle, ** ppPar;
    ppSingle = &FXU_HEAP_SINGLE_CURRENT(p, pSingle);
    while ( FXU_HEAP_SINGLE_PARENT_EXISTS(p,*ppSingle) )
    {
        ppPar = &FXU_HEAP_SINGLE_PARENT(p,*ppSingle);
        if ( FXU_HEAP_SINGLE_WEIGHT(*ppSingle) > FXU_HEAP_SINGLE_WEIGHT(*ppPar) )
        {
            Fxu_HeapSingleSwap( ppSingle, ppPar );
            ppSingle = ppPar;
        }
        else
            break;
    }
}